

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.hpp
# Opt level: O1

void __thiscall Encode::quickSortProbability(Encode *this,int L,int R)

{
  double dVar1;
  double dVar2;
  char cVar3;
  pointer pdVar4;
  pointer pcVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int R_00;
  int iVar9;
  long lVar10;
  double __tmp;
  
  do {
    R_00 = R;
    iVar9 = L;
    if (L <= R) {
      dVar1 = (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(R + L) / 2];
      do {
        pdVar4 = (this->m_probabilities).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start;
        lVar8 = (long)iVar9 + -1;
        iVar7 = iVar9;
        do {
          iVar9 = iVar7;
          dVar2 = pdVar4[lVar8 + 1];
          lVar8 = lVar8 + 1;
          iVar7 = iVar9 + 1;
        } while (dVar1 < dVar2);
        lVar10 = (long)R_00 + 1;
        iVar7 = R_00;
        do {
          R_00 = iVar7;
          lVar6 = lVar10 + -1;
          lVar10 = lVar10 + -1;
          iVar7 = R_00 + -1;
        } while (pdVar4[lVar6] < dVar1);
        if (lVar8 <= lVar10) {
          pdVar4[lVar8] = pdVar4[lVar6];
          pdVar4[lVar10] = dVar2;
          pcVar5 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          cVar3 = pcVar5[lVar8];
          pcVar5[lVar8] = pcVar5[lVar10];
          pcVar5[lVar10] = cVar3;
          R_00 = R_00 + -1;
          iVar9 = iVar9 + 1;
        }
      } while (iVar9 <= R_00);
    }
    if (L < R_00) {
      quickSortProbability(this,L,R_00);
    }
    L = iVar9;
  } while (iVar9 < R);
  return;
}

Assistant:

void quickSortProbability(int L, int R) {
        int i = L;
        int j = R;
        double temp = m_probabilities[(i + j) / 2];
        while (i <= j) {
            while (m_probabilities[i] > temp) {
                i++;
            }
            while (m_probabilities[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_probabilities[i], m_probabilities[j]);
                swap(m_data[i], m_data[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSortProbability(L, j);
        }
        if (i < R) {
            quickSortProbability(i, R);
        }
    }